

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

TypeRef clickhouse::Type::CreateEnum8
                  (vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
                   *enum_items)

{
  bool bVar1;
  Type *this;
  const_iterator this_00;
  reference pEVar2;
  mapped_type *this_01;
  mapped_type *pmVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  TypeRef TVar4;
  EnumItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_> *__range1;
  TypeRef *type;
  Type *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  int16_t in_stack_ffffffffffffff86;
  reference __k;
  __normal_iterator<const_clickhouse::Type::EnumItem_*,_std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  this = (Type *)operator_new(0x10);
  Type(this,(Code)((ulong)in_RDI >> 0x20));
  std::shared_ptr<clickhouse::Type>::shared_ptr<clickhouse::Type,void>
            ((shared_ptr<clickhouse::Type> *)
             CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  local_30 = local_10;
  local_38._M_current =
       (EnumItem *)
       std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>::begin
                 ((vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_> *
                  )in_stack_ffffffffffffff78);
  this_00 = std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>::
            end((vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_> *)
                in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_clickhouse::Type::EnumItem_*,_std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>_>
                             *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
                            (__normal_iterator<const_clickhouse::Type::EnumItem_*,_std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_clickhouse::Type::EnumItem_*,_std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>_>
             ::operator*(&local_38);
    __k = pEVar2;
    std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x245bb9);
    this_01 = std::
              map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00._M_current,(key_type *)__k);
    std::__cxx11::string::operator=((string *)this_01,(string *)pEVar2);
    in_stack_ffffffffffffff86 = __k->value;
    std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x245bfb);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                           *)this_00._M_current,&__k->name);
    *pmVar3 = in_stack_ffffffffffffff86;
    __gnu_cxx::
    __normal_iterator<const_clickhouse::Type::EnumItem_*,_std::vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>_>
    ::operator++(&local_38);
  }
  TVar4.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar4.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar4.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateEnum8(const std::vector<EnumItem>& enum_items) {
    TypeRef type(new Type(Type::Enum8));
    for (const auto& item : enum_items) {
        type->enum_->value_to_name[item.value] = item.name;
        type->enum_->name_to_value[item.name] = item.value;
    }
    return type;
}